

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcAnnotation::~IfcAnnotation(IfcAnnotation *this)

{
  ~IfcAnnotation(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

IfcAnnotation() : Object("IfcAnnotation") {}